

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O0

size_t portability_path_get_name(char *path,size_t path_size,char *name,size_t name_size)

{
  size_t sVar1;
  bool bVar2;
  size_t last;
  size_t count;
  size_t i;
  size_t name_size_local;
  char *name_local;
  size_t path_size_local;
  char *path_local;
  size_t local_8;
  
  if ((path == (char *)0x0) || (name == (char *)0x0)) {
    local_8 = 0;
  }
  else {
    i = 0;
    count = 0;
    last = 0;
    while( true ) {
      bVar2 = false;
      if ((path[i] != '\0') && (bVar2 = false, i < path_size)) {
        bVar2 = count < name_size;
      }
      if (!bVar2) break;
      sVar1 = count + 1;
      name[count] = path[i];
      if (path[i] == '/') {
        count = 0;
        sVar1 = count;
      }
      else if (path[i] == '.') {
        if ((i == 0) || (path[i - 1] != '.')) {
          if (sVar1 == 0) {
            last = 0;
          }
          else {
            last = count;
          }
        }
        else {
          last = 0;
          count = 0;
          sVar1 = count;
        }
      }
      count = sVar1;
      i = i + 1;
    }
    if ((last == 0) && (1 < count)) {
      last = count;
    }
    name[last] = '\0';
    local_8 = last + 1;
  }
  return local_8;
}

Assistant:

size_t portability_path_get_name(const char *path, size_t path_size, char *name, size_t name_size)
{
	if (path == NULL || name == NULL)
	{
		return 0;
	}

	size_t i, count, last;

	for (i = 0, count = 0, last = 0; path[i] != '\0' && i < path_size && count < name_size; ++i)
	{
		name[count++] = path[i];

		if (PORTABILITY_PATH_SEPARATOR(path[i]))
		{
			count = 0;
		}
		else if (path[i] == '.')
		{
			if (i > 0 && path[i - 1] == '.')
			{
				last = 0;
				count = 0;
			}
			else
			{
				if (count > 0)
				{
					last = count - 1;
				}
				else
				{
					last = 0;
				}
			}
		}
	}

	if (last == 0 && count > 1)
	{
		last = count;
	}

	name[last] = '\0';

	return last + 1;
}